

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::nasm::Inst> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::shared_ptr<Register>_> *mp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *this_00;
  element_type *this_01;
  element_type *peVar6;
  element_type *peVar7;
  shared_ptr<mocker::nasm::Register> *psVar8;
  element_type *this_02;
  shared_ptr<mocker::nasm::Addr> *psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  shared_ptr<mocker::nasm::Inst> sVar11;
  bool local_399;
  shared_ptr<mocker::nasm::Addr> local_398;
  shared_ptr<mocker::nasm::Addr> local_388;
  undefined1 local_378 [8];
  shared_ptr<mocker::nasm::IDiv> p_8;
  shared_ptr<mocker::nasm::Addr> local_358;
  shared_ptr<mocker::nasm::Addr> local_348;
  undefined1 local_334 [20];
  undefined1 local_320 [8];
  shared_ptr<mocker::nasm::Set> p_7;
  shared_ptr<mocker::nasm::Addr> local_300;
  shared_ptr<mocker::nasm::Addr> local_2f0;
  undefined1 local_2e0 [8];
  shared_ptr<mocker::nasm::Cmp> p_6;
  shared_ptr<mocker::nasm::Addr> local_2c0;
  shared_ptr<mocker::nasm::Addr> local_2b0;
  shared_ptr<mocker::nasm::Pop> local_2a0;
  undefined1 local_290 [8];
  shared_ptr<mocker::nasm::Pop> p_5;
  shared_ptr<mocker::nasm::Addr> local_270;
  shared_ptr<mocker::nasm::Addr> local_260;
  shared_ptr<mocker::nasm::Push> local_250;
  undefined1 local_240 [8];
  shared_ptr<mocker::nasm::Push> p_4;
  shared_ptr<mocker::nasm::Addr> local_220;
  undefined1 local_20c [20];
  undefined1 local_1f8 [8];
  shared_ptr<mocker::nasm::BinaryInst> p_3;
  shared_ptr<mocker::nasm::Addr> local_1d8;
  shared_ptr<mocker::nasm::Addr> local_1c8;
  undefined1 local_1b4 [20];
  undefined1 local_1a0 [8];
  shared_ptr<mocker::nasm::UnaryInst> p_2;
  shared_ptr<mocker::nasm::Addr> local_180;
  shared_ptr<mocker::nasm::Addr> local_170;
  shared_ptr<mocker::nasm::Addr> local_160;
  shared_ptr<mocker::nasm::Lea> local_150;
  undefined1 local_140 [8];
  shared_ptr<mocker::nasm::Lea> p_1;
  undefined1 local_128 [16];
  shared_ptr<mocker::nasm::Addr> local_118;
  undefined1 local_108 [16];
  shared_ptr<mocker::nasm::Addr> local_f8;
  shared_ptr<mocker::nasm::Addr> local_e8;
  undefined1 local_d8 [8];
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Cqo> local_c0;
  byte local_a9;
  shared_ptr<mocker::nasm::CJump> local_a8;
  byte local_91;
  shared_ptr<mocker::nasm::Inst> local_90;
  byte local_79;
  shared_ptr<mocker::nasm::Inst> local_78;
  byte local_61;
  shared_ptr<mocker::nasm::Call> local_60;
  byte local_4d;
  shared_ptr<mocker::nasm::Inst> local_40;
  shared_ptr<mocker::nasm::Empty> local_30;
  RegMap<std::shared_ptr<Register>_> *local_20;
  RegMap<std::shared_ptr<Register>_> *mp_local;
  shared_ptr<mocker::nasm::Inst> *inst_local;
  
  local_20 = mp;
  mp_local = (RegMap<std::shared_ptr<Register>_> *)inst;
  inst_local = (shared_ptr<mocker::nasm::Inst> *)this;
  dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>
            ((shared_ptr<mocker::nasm::Inst> *)&local_30);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_30);
  local_4d = 0;
  local_61 = 0;
  local_79 = 0;
  local_91 = 0;
  local_a9 = 0;
  p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  local_399 = true;
  if (!bVar2) {
    dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>(&local_40);
    local_4d = 1;
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_40);
    local_399 = true;
    if (!bVar2) {
      dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>
                ((shared_ptr<mocker::nasm::Inst> *)&local_60);
      local_61 = 1;
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_60);
      local_399 = true;
      if (!bVar2) {
        dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>(&local_78);
        local_79 = 1;
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_78);
        local_399 = true;
        if (!bVar2) {
          dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>(&local_90);
          local_91 = 1;
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_90);
          local_399 = true;
          if (!bVar2) {
            dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((shared_ptr<mocker::nasm::Inst> *)&local_a8);
            local_a9 = 1;
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_a8);
            local_399 = true;
            if (!bVar2) {
              dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((shared_ptr<mocker::nasm::Inst> *)&local_c0);
              p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _7_1_ = 1;
              local_399 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_c0);
            }
          }
        }
      }
    }
  }
  if ((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ &
      1) != 0) {
    std::shared_ptr<mocker::nasm::Cqo>::~shared_ptr(&local_c0);
  }
  if ((local_a9 & 1) != 0) {
    std::shared_ptr<mocker::nasm::CJump>::~shared_ptr(&local_a8);
  }
  if ((local_91 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Jmp>::~shared_ptr((shared_ptr<mocker::nasm::Jmp> *)&local_90);
  }
  if ((local_79 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Leave>::~shared_ptr((shared_ptr<mocker::nasm::Leave> *)&local_78);
  }
  if ((local_61 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Call>::~shared_ptr(&local_60);
  }
  if ((local_4d & 1) != 0) {
    std::shared_ptr<mocker::nasm::Ret>::~shared_ptr((shared_ptr<mocker::nasm::Ret> *)&local_40);
  }
  std::shared_ptr<mocker::nasm::Empty>::~shared_ptr(&local_30);
  if (local_399 == false) {
    dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)local_d8);
    p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
         std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
    if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_) {
      std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )local_d8);
      Mov::getDest((Mov *)local_108);
      replaceRegs((nasm *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)local_108,local_20);
      std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )local_d8);
      Mov::getOperand((Mov *)local_128);
      replaceRegs((nasm *)&local_118,(shared_ptr<mocker::nasm::Addr> *)local_128,local_20);
      std::
      make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
                (&local_e8,&local_f8);
      std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Mov,void>
                ((shared_ptr<mocker::nasm::Inst> *)this,(shared_ptr<mocker::nasm::Mov> *)&local_e8);
      std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)&local_e8);
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_118);
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_128);
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_f8);
      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_108);
    }
    p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ =
         0;
    std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)local_d8);
    _Var10._M_pi = extraout_RDX_00;
    if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ == 0) {
      dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                ((shared_ptr<mocker::nasm::Inst> *)local_140);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_140);
      if (bVar2) {
        peVar3 = std::
                 __shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
        psVar8 = Lea::getDest(peVar3);
        std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                  (&local_180,psVar8);
        replaceRegs((nasm *)&local_170,&local_180,local_20);
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>(&local_160);
        peVar3 = std::
                 __shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
        psVar9 = Lea::getAddr(peVar3);
        replaceRegs((nasm *)&p_2.
                             super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,psVar9,local_20);
        std::
        make_shared<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Addr>>
                  ((shared_ptr<mocker::nasm::Register> *)&local_150,&local_160);
        std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Lea,void>
                  ((shared_ptr<mocker::nasm::Inst> *)this,&local_150);
        std::shared_ptr<mocker::nasm::Lea>::~shared_ptr(&local_150);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)
                   &p_2.super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)&local_160);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_170);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_180);
      }
      p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_
           = 0;
      p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_
           = bVar2;
      std::shared_ptr<mocker::nasm::Lea>::~shared_ptr((shared_ptr<mocker::nasm::Lea> *)local_140);
      _Var10._M_pi = extraout_RDX_01;
      if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ == 0) {
        dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((shared_ptr<mocker::nasm::Inst> *)local_1a0);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
        if (bVar2) {
          peVar4 = std::
                   __shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1a0);
          local_1b4._0_4_ = UnaryInst::getOp(peVar4);
          peVar4 = std::
                   __shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1a0);
          psVar8 = UnaryInst::getReg(peVar4);
          p_Var1 = &p_3.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                    ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar8);
          replaceRegs((nasm *)&local_1d8,(shared_ptr<mocker::nasm::Addr> *)p_Var1,local_20);
          dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>(&local_1c8);
          std::
          make_shared<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>>
                    ((OpType *)(local_1b4 + 4),(shared_ptr<mocker::nasm::Register> *)local_1b4);
          std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::UnaryInst,void>
                    ((shared_ptr<mocker::nasm::Inst> *)this,
                     (shared_ptr<mocker::nasm::UnaryInst> *)(local_1b4 + 4));
          std::shared_ptr<mocker::nasm::UnaryInst>::~shared_ptr
                    ((shared_ptr<mocker::nasm::UnaryInst> *)(local_1b4 + 4));
          std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Register> *)&local_1c8);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_1d8);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Addr> *)
                     &p_3.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_3_ = 0;
        p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = bVar2;
        std::shared_ptr<mocker::nasm::UnaryInst>::~shared_ptr
                  ((shared_ptr<mocker::nasm::UnaryInst> *)local_1a0);
        _Var10._M_pi = extraout_RDX_02;
        if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ == 0) {
          dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)local_1f8);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1f8);
          if (bVar2) {
            peVar5 = std::
                     __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1f8);
            local_20c._0_4_ = BinaryInst::getType(peVar5);
            peVar5 = std::
                     __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1f8);
            psVar9 = BinaryInst::getLhs(peVar5);
            replaceRegs((nasm *)&local_220,psVar9,local_20);
            peVar5 = std::
                     __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1f8);
            psVar9 = BinaryInst::getRhs(peVar5);
            replaceRegs((nasm *)&p_4.
                                 super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,psVar9,local_20);
            std::
            make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
                      ((OpType *)(local_20c + 4),(shared_ptr<mocker::nasm::Addr> *)local_20c,
                       &local_220);
            std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::BinaryInst,void>
                      ((shared_ptr<mocker::nasm::Inst> *)this,
                       (shared_ptr<mocker::nasm::BinaryInst> *)(local_20c + 4));
            std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
                      ((shared_ptr<mocker::nasm::BinaryInst> *)(local_20c + 4));
            std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                      ((shared_ptr<mocker::nasm::Addr> *)
                       &p_4.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_220);
          }
          p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _5_3_ = 0;
          p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_1_ = bVar2;
          std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
                    ((shared_ptr<mocker::nasm::BinaryInst> *)local_1f8);
          _Var10._M_pi = extraout_RDX_03;
          if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ == 0) {
            dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((shared_ptr<mocker::nasm::Inst> *)local_240);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_240);
            if (bVar2) {
              this_00 = std::
                        __shared_ptr_access<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_240);
              psVar8 = Push::getReg(this_00);
              p_Var1 = &p_5.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                        ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar8);
              replaceRegs((nasm *)&local_270,(shared_ptr<mocker::nasm::Addr> *)p_Var1,local_20);
              dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>(&local_260);
              std::make_shared<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>>
                        ((shared_ptr<mocker::nasm::Register> *)&local_250);
              std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Push,void>
                        ((shared_ptr<mocker::nasm::Inst> *)this,&local_250);
              std::shared_ptr<mocker::nasm::Push>::~shared_ptr(&local_250);
              std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Register> *)&local_260);
              std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_270);
              std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Addr> *)
                         &p_5.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _5_3_ = 0;
            p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_1_ = bVar2;
            std::shared_ptr<mocker::nasm::Push>::~shared_ptr
                      ((shared_ptr<mocker::nasm::Push> *)local_240);
            _Var10._M_pi = extraout_RDX_04;
            if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_ == 0) {
              dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((shared_ptr<mocker::nasm::Inst> *)local_290);
              bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_290);
              if (bVar2) {
                this_01 = std::
                          __shared_ptr_access<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_290);
                psVar8 = Pop::getReg(this_01);
                p_Var1 = &p_6.super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                          ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar8);
                replaceRegs((nasm *)&local_2c0,(shared_ptr<mocker::nasm::Addr> *)p_Var1,local_20);
                dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>(&local_2b0);
                std::make_shared<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Register>>
                          ((shared_ptr<mocker::nasm::Register> *)&local_2a0);
                std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Pop,void>
                          ((shared_ptr<mocker::nasm::Inst> *)this,&local_2a0);
                std::shared_ptr<mocker::nasm::Pop>::~shared_ptr(&local_2a0);
                std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Register> *)&local_2b0);
                std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_2c0);
                std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Addr> *)
                           &p_6.super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._5_3_ = 0;
              p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_1_ = bVar2;
              std::shared_ptr<mocker::nasm::Pop>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Pop> *)local_290);
              _Var10._M_pi = extraout_RDX_05;
              if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_4_ == 0) {
                dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((shared_ptr<mocker::nasm::Inst> *)local_2e0);
                bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2e0);
                if (bVar2) {
                  peVar6 = std::
                           __shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_2e0);
                  psVar9 = Cmp::getLhs(peVar6);
                  replaceRegs((nasm *)&local_300,psVar9,local_20);
                  peVar6 = std::
                           __shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_2e0);
                  psVar9 = Cmp::getRhs(peVar6);
                  replaceRegs((nasm *)&p_7.
                                       super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,psVar9,local_20);
                  std::
                  make_shared<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
                            (&local_2f0,&local_300);
                  std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Cmp,void>
                            ((shared_ptr<mocker::nasm::Inst> *)this,
                             (shared_ptr<mocker::nasm::Cmp> *)&local_2f0);
                  std::shared_ptr<mocker::nasm::Cmp>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Cmp> *)&local_2f0);
                  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Addr> *)
                             &p_7.super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_300);
                }
                p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._5_3_ = 0;
                p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_1_ = bVar2;
                std::shared_ptr<mocker::nasm::Cmp>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Cmp> *)local_2e0);
                _Var10._M_pi = extraout_RDX_06;
                if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ == 0) {
                  dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((shared_ptr<mocker::nasm::Inst> *)local_320);
                  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_320);
                  if (bVar2) {
                    peVar7 = std::
                             __shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_320);
                    local_334._0_4_ = Set::getOp(peVar7);
                    peVar7 = std::
                             __shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_320);
                    psVar8 = Set::getReg(peVar7);
                    p_Var1 = &p_8.super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                              ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar8);
                    replaceRegs((nasm *)&local_358,(shared_ptr<mocker::nasm::Addr> *)p_Var1,local_20
                               );
                    dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>(&local_348);
                    std::
                    make_shared<mocker::nasm::Set,mocker::nasm::Set::OpType,std::shared_ptr<mocker::nasm::Register>>
                              ((OpType *)(local_334 + 4),
                               (shared_ptr<mocker::nasm::Register> *)local_334);
                    std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Set,void>
                              ((shared_ptr<mocker::nasm::Inst> *)this,
                               (shared_ptr<mocker::nasm::Set> *)(local_334 + 4));
                    std::shared_ptr<mocker::nasm::Set>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Set> *)(local_334 + 4));
                    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Register> *)&local_348);
                    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_358);
                    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Addr> *)
                               &p_8.
                                super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                  }
                  p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._5_3_ = 0;
                  p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_1_ = bVar2;
                  std::shared_ptr<mocker::nasm::Set>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Set> *)local_320);
                  _Var10._M_pi = extraout_RDX_07;
                  if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_ == 0) {
                    dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((shared_ptr<mocker::nasm::Inst> *)local_378);
                    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_378);
                    if (bVar2) {
                      this_02 = std::
                                __shared_ptr_access<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_378);
                      psVar9 = IDiv::getRhs(this_02);
                      replaceRegs((nasm *)&local_398,psVar9,local_20);
                      std::make_shared<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Addr>>
                                (&local_388);
                      std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::IDiv,void>
                                ((shared_ptr<mocker::nasm::Inst> *)this,
                                 (shared_ptr<mocker::nasm::IDiv> *)&local_388);
                      std::shared_ptr<mocker::nasm::IDiv>::~shared_ptr
                                ((shared_ptr<mocker::nasm::IDiv> *)&local_388);
                      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_398);
                    }
                    p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._5_3_ = 0;
                    p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_1_ = bVar2;
                    std::shared_ptr<mocker::nasm::IDiv>::~shared_ptr
                              ((shared_ptr<mocker::nasm::IDiv> *)local_378);
                    _Var10._M_pi = extraout_RDX_08;
                    if (p_1.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_ == 0) {
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                    ,0xdd,
                                    "std::shared_ptr<Inst> mocker::nasm::replaceRegs(const std::shared_ptr<Inst> &, const RegMap<std::shared_ptr<Register>> &)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::shared_ptr<mocker::nasm::Inst>::shared_ptr
              ((shared_ptr<mocker::nasm::Inst> *)this,(shared_ptr<mocker::nasm::Inst> *)mp_local);
    _Var10._M_pi = extraout_RDX;
  }
  sVar11.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  sVar11.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Inst>)
         sVar11.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Inst> replaceRegs(const std::shared_ptr<Inst> &inst,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Call>(inst) ||
      dyc<Leave>(inst) || dyc<Jmp>(inst) || dyc<CJump>(inst) || dyc<Cqo>(inst))
    return inst;
  if (auto p = dyc<Mov>(inst)) {
    return std::make_shared<Mov>(replaceRegs(p->getDest(), mp),
                                 replaceRegs(p->getOperand(), mp));
  }
  if (auto p = dyc<Lea>(inst)) {
    return std::make_shared<Lea>(dyc<Register>(replaceRegs(p->getDest(), mp)),
                                 replaceRegs(p->getAddr(), mp));
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return std::make_shared<UnaryInst>(
        p->getOp(), dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return std::make_shared<BinaryInst>(p->getType(),
                                        replaceRegs(p->getLhs(), mp),
                                        replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Push>(inst)) {
    return std::make_shared<Push>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Pop>(inst)) {
    return std::make_shared<Pop>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Cmp>(inst)) {
    return std::make_shared<Cmp>(replaceRegs(p->getLhs(), mp),
                                 replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Set>(inst)) {
    return std::make_shared<Set>(p->getOp(),
                                 dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return std::make_shared<IDiv>(replaceRegs(p->getRhs(), mp));
  }
  assert(false);
}